

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject_p_p.h
# Opt level: O2

void __thiscall QObjectPrivate::ConnectionData::resizeSignalVector(ConnectionData *this,size_t size)

{
  __pointer_type __src;
  quintptr qVar1;
  bool bVar2;
  __pointer_type __dest;
  long lVar3;
  __pointer_type pSVar4;
  long in_FS_OFFSET;
  anon_union_8_2_521c276c_for_ConnectionOrSignalVector_0 local_40;
  size_t size_local;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  __src = (this->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b
          ._M_p;
  if ((__src == (__pointer_type)0x0) || (size_local = size, __src->allocated <= size)) {
    size_local = size + 7 & 0xfffffffffffffff8;
    __dest = (__pointer_type)QtPrivate::fittedMalloc(0x10,&size_local,0x10,1);
    if (__src == (__pointer_type)0x0) {
      lVar3 = -1;
    }
    else {
      qVar1 = __src->allocated;
      memcpy(__dest,__src,qVar1 * 0x10 + 0x20);
      lVar3 = (long)(int)qVar1;
    }
    pSVar4 = __dest + lVar3 + 2;
    for (; lVar3 < (int)size_local; lVar3 = lVar3 + 1) {
      (pSVar4->super_ConnectionOrSignalVector).field_0.next = (Connection *)0x0;
      pSVar4->allocated = 0;
      pSVar4 = pSVar4 + 1;
    }
    (__dest->super_ConnectionOrSignalVector).field_0.next = (Connection *)0x0;
    __dest->allocated = size_local;
    (this->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b._M_p
         = __dest;
    if (__src != (__pointer_type)0x0) {
      local_40 = (anon_union_8_2_521c276c_for_ConnectionOrSignalVector_0)(this->orphaned)._M_i.c;
      do {
        (__src->super_ConnectionOrSignalVector).field_0 = local_40;
        bVar2 = std::atomic<QObjectPrivate::TaggedSignalVector>::compare_exchange_strong
                          (&this->orphaned,&local_40.nextInOrphanList,
                           (TaggedSignalVector)((ulong)__src | 1),memory_order_release);
      } while (!bVar2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void resizeSignalVector(size_t size)
    {
        SignalVector *vector = this->signalVector.loadRelaxed();
        if (vector && vector->allocated > size)
            return;
        size = (size + 7) & ~7;
        void *ptr = QtPrivate::fittedMalloc(sizeof(SignalVector), &size, sizeof(ConnectionList), 1);
        auto newVector = new (ptr) SignalVector;

        int start = -1;
        if (vector) {
            // not (yet) existing trait:
            // static_assert(std::is_relocatable_v<SignalVector>);
            // static_assert(std::is_relocatable_v<ConnectionList>);
            memcpy(newVector, vector,
                   sizeof(SignalVector) + (vector->allocated + 1) * sizeof(ConnectionList));
            start = vector->count();
        }
        for (int i = start; i < int(size); ++i)
            new (&newVector->at(i)) ConnectionList();
        newVector->next = nullptr;
        newVector->allocated = size;

        signalVector.storeRelaxed(newVector);
        if (vector) {
            TaggedSignalVector o = nullptr;
            /* No ABA issue here: When adding a node, we only care about the list head, it doesn't
             * matter if the tail changes.
             */
            o = orphaned.load(std::memory_order_acquire);
            do {
                vector->nextInOrphanList = o;
            } while (!orphaned.compare_exchange_strong(o, TaggedSignalVector(vector), std::memory_order_release));
        }
    }